

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool ParseList(TidyDocImpl *doc,TidyOptionImpl *option)

{
  TidyConfigImpl *config;
  TidyConfigChangeCallback p_Var1;
  bool bVar2;
  tchar c;
  tchar tVar3;
  Bool BVar4;
  tmbstr b;
  TidyOption opt;
  ulong uVar5;
  TidyDoc tdoc;
  int iVar6;
  tmbchar buf [1024];
  
  p_Var1 = doc->pConfigChangeCallback;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if (p_Var1 == (TidyConfigChangeCallback)0x0) {
    b = (ctmbstr)0x0;
  }
  else {
    b = prvTidytmbstrdup(doc->allocator,(doc->config).value[option->id].p);
  }
  iVar6 = 0;
  SetOptionValue(doc,option->id,(ctmbstr)0x0);
  if ((doc->config).c == 0xffffffff) {
    return yes;
  }
  config = &doc->config;
  c = SkipWhite(config);
LAB_0014aed7:
  if (c < 0x2d) {
    if ((0x100100000200U >> ((ulong)c & 0x3f) & 1) != 0) {
      c = AdvanceChar(config);
      goto LAB_0014af7c;
    }
    if ((0x2400UL >> ((ulong)c & 0x3f) & 1) != 0) {
      tVar3 = AdvanceChar(config);
      bVar2 = c == 0xd;
      c = tVar3;
      if (tVar3 == 10 && bVar2) {
        c = AdvanceChar(config);
      }
      BVar4 = prvTidyIsWhite(c);
      if (BVar4 != no) goto LAB_0014af29;
      buf[0] = '\0';
      prvTidyUngetChar(c,(doc->config).cfgIn);
      prvTidyUngetChar(10,(doc->config).cfgIn);
      goto LAB_0014afb1;
    }
  }
LAB_0014af29:
  uVar5 = 0;
  while ((((uVar5 < 0x3fe && (c != 0xffffffff)) && (BVar4 = prvTidyIsWhite(c), BVar4 == no)) &&
         (c != 0x2c))) {
    buf[uVar5] = (tmbchar)c;
    uVar5 = uVar5 + 1;
    c = AdvanceChar(config);
  }
  buf[uVar5] = '\0';
  if (uVar5 != 0) {
    prvTidyDeclareListItem(doc,option,buf);
    iVar6 = iVar6 + 1;
  }
LAB_0014af7c:
  if (c == 0xffffffff) {
LAB_0014afb1:
    if (p_Var1 != (TidyConfigChangeCallback)0x0) {
      BVar4 = OptionChangedValuesDiffer((doc->config).value[option->id].p,b);
      doc->pConfigChangeCallback = p_Var1;
      if (b != (ctmbstr)0x0) {
        (*doc->allocator->vtbl->free)(doc->allocator,b);
      }
      if ((BVar4 != no) && (doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0)) {
        (*doc->pConfigChangeCallback)((TidyDoc)doc,(TidyOption)option);
      }
    }
    return (uint)(iVar6 != 0);
  }
  goto LAB_0014aed7;
}

Assistant:

Bool ParseList( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    tmbchar buf[1024];
    uint i = 0, nItems = 0;
    uint c;
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    tmbstr oldbuff = NULL;

    /* Handle comparing before and after for the config change callback.
       We have do handle this manually, because otherwise TY_(DeclareListItem)
       would fire a callback for EVERY list item being added. */
    doc->pConfigChangeCallback = NULL;
    if ( callback )
    {
        TidyOptionValue* oldval = &(doc->config.value[ option->id ]);
        oldbuff = TY_(tmbstrdup)( doc->allocator, oldval->p );
    }

    SetOptionValue( doc, option->id, NULL );

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
        return yes;

    c = SkipWhite( cfg );

    do
    {
        if (c == ' ' || c == '\t' || c == ',')
        {
            c = AdvanceChar( cfg );
            continue;
        }

        if ( c == '\r' || c == '\n' )
        {
            uint c2 = AdvanceChar( cfg );
            if ( c == '\r' && c2 == '\n' )
                c = AdvanceChar( cfg );
            else
                c = c2;

            if ( !TY_(IsWhite)(c) )
            {
                buf[i] = 0;
                TY_(UngetChar)( c, cfg->cfgIn );
                TY_(UngetChar)( '\n', cfg->cfgIn );
                break;
            }
        }

        while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) && c != ',' )
        {
            buf[i++] = (tmbchar) c;
            c = AdvanceChar( cfg );
        }

        buf[i] = '\0';
        if (i == 0)          /* Skip empty attribute definition. Possible when */
            continue;        /* there is a trailing space on the line. */

        /* add attribute to array */
        TY_(DeclareListItem)( doc, option, buf );

        i = 0;
        ++nItems;
    }
    while ( c != EndOfStream );

    if ( i > 0 )
        TY_(DeclareListItem)( doc, option, buf );

    /* If there's a callback, compare the old and new values, and fire
       the callback appropriately. */
    if ( callback )
    {
        TidyOptionValue* val = &(doc->config.value[ option->id ]);
        Bool fire_callback = OptionChangedValuesDiffer( val->p, oldbuff);

        doc->pConfigChangeCallback = callback;

        if ( oldbuff )
            TidyFree( doc->allocator, oldbuff );

        if ( fire_callback )
            PerformOptionChangedCallback( doc, option );
    }

    return ( nItems > 0 );
}